

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIFFImageHandler.cpp
# Opt level: O3

tsize_t __thiscall
TIFFImageHandler::SampleLABSignedToUnsigned
          (TIFFImageHandler *this,tdata_t inBuffer,uint32_t inSampleCount)

{
  byte *pbVar1;
  long lVar2;
  
  if (inSampleCount != 0) {
    lVar2 = 0;
    do {
      pbVar1 = (byte *)((long)inBuffer + (ulong)((int)lVar2 + 1));
      *pbVar1 = *pbVar1 ^ 0x80;
      pbVar1 = (byte *)((long)inBuffer + (ulong)((int)lVar2 + 2));
      *pbVar1 = *pbVar1 ^ 0x80;
      lVar2 = lVar2 + 3;
    } while ((ulong)inSampleCount * 3 != lVar2);
  }
  return (ulong)(inSampleCount * 3);
}

Assistant:

tsize_t	TIFFImageHandler::SampleLABSignedToUnsigned(tdata_t inBuffer, uint32_t inSampleCount)
{
	uint32_t i=0;

	for(i=0;i<inSampleCount;i++)
	{
		if( (((unsigned char*)inBuffer)[(i*3)+1] & 0x80) !=0)
		{
			((unsigned char*)inBuffer)[(i*3)+1] =
				(unsigned char)(0x80 + ((char*)inBuffer)[(i*3)+1]);
		} 
		else 
		{
			((unsigned char*)inBuffer)[(i*3)+1] |= 0x80;
		}
		if( (((unsigned char*)inBuffer)[(i*3)+2] & 0x80) !=0)
		{
			((unsigned char*)inBuffer)[(i*3)+2] =
				(unsigned char)(0x80 + ((char*)inBuffer)[(i*3)+2]);
		} 
		else 
		{
			((unsigned char*)inBuffer)[(i*3)+2] |= 0x80;
		}
	}
	return(inSampleCount*3);	
}